

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O3

void __thiscall dtc::dtb::binary_writer::write_data(binary_writer *this,uint32_t v)

{
  int bit;
  int iVar1;
  uchar local_2a;
  uchar local_29;
  
  if ((*(int *)&(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start & 3U) != 0) {
    do {
      local_2a = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->buffer,&local_2a);
    } while ((*(int *)&(this->buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(this->buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start & 3U) != 0);
  }
  iVar1 = 0x18;
  do {
    local_29 = (uchar)(v >> ((byte)iVar1 & 0x1f));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->buffer,&local_29);
    iVar1 = iVar1 + -8;
  } while (iVar1 != -8);
  return;
}

Assistant:

void
binary_writer::write_data(uint32_t v)
{
	while (buffer.size() % 4 != 0)
	{
		buffer.push_back(0);
	}
	push_big_endian(buffer, v);
}